

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objfile.c
# Opt level: O0

void write_int32(int val)

{
  size_t sVar1;
  char bytes [4];
  undefined1 local_8 [8];
  
  sVar1 = fwrite(local_8,1,4,(FILE *)out);
  if (sVar1 != 4) {
    ccerr(F,"error while writing to the output file");
  }
  return;
}

Assistant:

void write_int32(int val)
{
    char bytes[4];
    bytes[0] = ((val & 0x000000FF));
    bytes[1] = ((val & 0x0000FF00) >> 8);
    bytes[2] = ((val & 0x00FF0000) >> 16);
    bytes[3] = ((val & 0xFF000000) >> 24);
    if (fwrite(bytes, 1, 4, out) != 4)
        ccerr(F, "error while writing to the output file");
}